

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O2

void nn_atcp_start(nn_atcp *self,nn_usock *listener)

{
  if (self->state == 1) {
    self->listener = listener;
    (self->listener_owner).src = 3;
    (self->listener_owner).fsm = &self->fsm;
    nn_usock_swap_owner(listener,&self->listener_owner);
    nn_fsm_start(&self->fsm);
    return;
  }
  fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
          "NN_ATCP_STATE_IDLE",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
          ,0x54);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_atcp_start (struct nn_atcp *self, struct nn_usock *listener)
{
    nn_assert_state (self, NN_ATCP_STATE_IDLE);

    /*  Take ownership of the listener socket. */
    self->listener = listener;
    self->listener_owner.src = NN_ATCP_SRC_LISTENER;
    self->listener_owner.fsm = &self->fsm;
    nn_usock_swap_owner (listener, &self->listener_owner);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}